

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# except.cc
# Opt level: O0

void __thiscall
kratos::StmtException::
print_nodes<__gnu_cxx::__normal_iterator<kratos::IRNode*const*,std::vector<kratos::IRNode*,std::allocator<kratos::IRNode*>>>>
          (StmtException *this,
          __normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
          begin,__normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
                end)

{
  bool bVar1;
  reference ppIVar2;
  __normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
  local_28;
  __normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
  it;
  StmtException *this_local;
  __normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
  end_local;
  __normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
  begin_local;
  
  local_28._M_current = begin._M_current;
  it._M_current = (IRNode **)this;
  this_local = (StmtException *)end._M_current;
  end_local._M_current = begin._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
                        *)&this_local);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
              ::operator*(&local_28);
    print_ast_node(*ppIVar2);
    __gnu_cxx::
    __normal_iterator<kratos::IRNode_*const_*,_std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>_>
    ::operator++(&local_28,0);
  }
  return;
}

Assistant:

void StmtException::print_nodes(T begin, T end) noexcept {
    for (auto it = begin; it != end; it++) {
        print_ast_node(*it);
    }
}